

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhigles2.cpp
# Opt level: O1

void __thiscall
QGles2GraphicsPipeline::QGles2GraphicsPipeline(QGles2GraphicsPipeline *this,QRhiImplementation *rhi)

{
  QRhiGraphicsPipeline::QRhiGraphicsPipeline(&this->super_QRhiGraphicsPipeline,rhi);
  (this->super_QRhiGraphicsPipeline).super_QRhiResource._vptr_QRhiResource =
       (_func_int **)&PTR__QGles2GraphicsPipeline_007efcc8;
  this->program = 0;
  this->drawMode = 4;
  (this->uniforms).super_QVLABase<QGles2UniformDescription>.super_QVLABaseBase.a = 8;
  (this->uniforms).super_QVLABase<QGles2UniformDescription>.super_QVLABaseBase.s = 0;
  (this->uniforms).super_QVLABase<QGles2UniformDescription>.super_QVLABaseBase.ptr =
       &(this->uniforms).super_QVLAStorage<24UL,_4UL,_8LL>;
  (this->samplers).super_QVLABase<QGles2SamplerDescription>.super_QVLABaseBase.a = 4;
  (this->samplers).super_QVLABase<QGles2SamplerDescription>.super_QVLABaseBase.s = 0;
  (this->samplers).super_QVLABase<QGles2SamplerDescription>.super_QVLABaseBase.ptr =
       &(this->samplers).super_QVLAStorage<16UL,_4UL,_4LL>;
  this->currentSrb = (QRhiShaderResourceBindings *)0x0;
  this->currentSrbGeneration = 0;
  this->lastUsedInFrameNo = 0;
  this->generation = 0;
  return;
}

Assistant:

QGles2GraphicsPipeline::QGles2GraphicsPipeline(QRhiImplementation *rhi)
    : QRhiGraphicsPipeline(rhi)
{
}